

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

void __thiscall icu_63::OffsetList::setMaxLength(OffsetList *this,int32_t maxLength)

{
  UBool *pUVar1;
  
  if (maxLength < 0x11) {
    this->capacity = 0x10;
    maxLength = 0x10;
  }
  else {
    pUVar1 = (UBool *)uprv_malloc_63((ulong)(uint)maxLength);
    if (pUVar1 == (UBool *)0x0) {
      maxLength = this->capacity;
    }
    else {
      this->list = pUVar1;
      this->capacity = maxLength;
    }
  }
  memset(this->list,0,(long)maxLength);
  return;
}

Assistant:

void setMaxLength(int32_t maxLength) {
        if(maxLength<=(int32_t)sizeof(staticList)) {
            capacity=(int32_t)sizeof(staticList);
        } else {
            UBool *l=(UBool *)uprv_malloc(maxLength);
            if(l!=NULL) {
                list=l;
                capacity=maxLength;
            }
        }
        uprv_memset(list, 0, capacity);
    }